

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O2

bool __thiscall
Js::ES5Array::SetPropertyBuiltIns
          (ES5Array *this,PropertyId propertyId,Var value,
          PropertyOperationFlags propertyOperationFlags,BOOL *result)

{
  ImplicitCallFlags *pIVar1;
  ScriptContext *scriptContext;
  int iVar2;
  uint32 uVar3;
  uint32 uVar4;
  DynamicTypeHandler *pDVar5;
  BOOL BVar6;
  
  if (propertyId == 0xd1) {
    scriptContext =
         (((((this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    pDVar5 = DynamicObject::GetTypeHandler((DynamicObject *)this);
    iVar2 = (*pDVar5->_vptr_DynamicTypeHandler[0x41])(pDVar5);
    BVar6 = 0;
    if ((char)iVar2 != '\0') {
      uVar3 = ToLengthValue(value,scriptContext);
      pDVar5 = DynamicObject::GetTypeHandler((DynamicObject *)this);
      uVar4 = (*pDVar5->_vptr_DynamicTypeHandler[0x42])
                        (pDVar5,this,(ulong)uVar3,(ulong)propertyOperationFlags);
      BVar6 = 1;
      if (uVar3 != uVar4) {
        pIVar1 = &scriptContext->threadContext->implicitCallFlags;
        *pIVar1 = *pIVar1 | ImplicitCall_NoOpSet;
      }
    }
    *result = BVar6;
  }
  return propertyId == 0xd1;
}

Assistant:

bool ES5Array::SetPropertyBuiltIns(PropertyId propertyId, Var value, PropertyOperationFlags propertyOperationFlags, BOOL* result)
    {
        ScriptContext* scriptContext = GetScriptContext();

        if (propertyId == PropertyIds::length)
        {
            if (!GetTypeHandler()->IsLengthWritable())
            {
                *result = false; // reject
                return true;
            }

            uint32 newLen = ToLengthValue(value, scriptContext);
            uint32 assignedLen = GetTypeHandler()->SetLength(this, newLen, propertyOperationFlags);
            if (newLen != assignedLen)
            {
                scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
            }
            *result = true;
            return true;
        }

        return false;
    }